

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_raw.c
# Opt level: O3

int archive_write_raw_header(archive_write *a,archive_entry *entry)

{
  int iVar1;
  int *piVar2;
  mode_t mVar3;
  char *fmt;
  
  piVar2 = (int *)a->format_data;
  mVar3 = archive_entry_filetype(entry);
  if (mVar3 == 0x8000) {
    iVar1 = *piVar2;
    if (iVar1 < 1) {
      *piVar2 = iVar1 + 1;
      return 0;
    }
    fmt = "Raw format only supports one entry per archive";
  }
  else {
    fmt = "Raw format only supports filetype AE_IFREG";
  }
  archive_set_error(&a->archive,0x22,fmt);
  return -0x1e;
}

Assistant:

static int
archive_write_raw_header(struct archive_write *a, struct archive_entry *entry)
{
	struct raw *raw = (struct raw *)a->format_data;

	if (archive_entry_filetype(entry) != AE_IFREG) {
		archive_set_error(&a->archive, ERANGE,
		    "Raw format only supports filetype AE_IFREG");
		return (ARCHIVE_FATAL);
	}


	if (raw->entries_written > 0) {
		archive_set_error(&a->archive, ERANGE,
		    "Raw format only supports one entry per archive");
		return (ARCHIVE_FATAL);
	}
	raw->entries_written++;

	return (ARCHIVE_OK);
}